

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O3

SRes LookInStream_LookRead(ILookInStream *stream,void *buf,size_t *size)

{
  SRes SVar1;
  void *lookBuf;
  void *local_20;
  
  if (*size != 0) {
    SVar1 = (*stream->Look)(stream,&local_20,size);
    if (SVar1 == 0) {
      memcpy(buf,local_20,*size);
      SVar1 = (*stream->Skip)(stream,*size);
    }
    return SVar1;
  }
  return 0;
}

Assistant:

SRes LookInStream_LookRead(ILookInStream *stream, void *buf, size_t *size)
{
  const void *lookBuf;
  if (*size == 0)
    return SZ_OK;
  RINOK(stream->Look(stream, &lookBuf, size));
  memcpy(buf, lookBuf, *size);
  return stream->Skip(stream, *size);
}